

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_regexp_Symbol_search(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  BOOL BVar1;
  int iVar2;
  ulong uVar3;
  int64_t iVar4;
  ulong uVar5;
  JSValue JVar6;
  JSValue op1;
  JSValue obj;
  JSValue op1_00;
  int local_38;
  
  if ((int)this_val.tag == -1) {
    JVar6 = JS_ToStringInternal(ctx,*argv,0);
    if ((uint)JVar6.tag == 6) {
      obj = (JSValue)(ZEXT816(3) << 0x40);
      op1_00 = (JSValue)(ZEXT816(3) << 0x40);
      op1 = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_00142bc9;
    }
    op1 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
    if ((int)op1.tag == 6) {
      obj = (JSValue)(ZEXT816(3) << 0x40);
LAB_00142bc4:
      op1_00 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      BVar1 = js_same_value(ctx,op1,(JSValue)ZEXT816(0));
      if ((BVar1 == 0) &&
         (iVar2 = JS_SetPropertyInternal(ctx,this_val,0x55,(JSValue)ZEXT816(0),0x4000), iVar2 < 0))
      {
        obj = (JSValue)(ZEXT816(3) << 0x40);
        goto LAB_00142bc4;
      }
      obj = JS_RegExpExec(ctx,this_val,JVar6);
      if ((obj.tag & 0xffffffffU) == 6) goto LAB_00142bc4;
      op1_00 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
      if ((int)op1_00.tag != 6) {
        BVar1 = js_same_value(ctx,op1_00,op1);
        if (BVar1 == 0) {
          iVar2 = JS_SetPropertyInternal(ctx,this_val,0x55,op1,0x4000);
          if (iVar2 < 0) {
            op1 = (JSValue)(ZEXT816(3) << 0x40);
            goto LAB_00142bc9;
          }
        }
        else {
          JS_FreeValue(ctx,op1);
        }
        JS_FreeValue(ctx,JVar6);
        JS_FreeValue(ctx,op1_00);
        local_38 = (int)obj.tag;
        if (local_38 == 2) {
          uVar5 = 0xffffffff;
          uVar3 = 0;
          iVar4 = 0;
        }
        else {
          JVar6 = JS_GetPropertyInternal(ctx,obj,0x57,obj,0);
          iVar4 = JVar6.tag;
          JS_FreeValue(ctx,obj);
          uVar3 = (ulong)JVar6.u.ptr & 0xffffffff00000000;
          uVar5 = (ulong)JVar6.u.ptr & 0xffffffff;
        }
        goto LAB_00142ca6;
      }
    }
LAB_00142bc9:
    if ((0xfffffff4 < (uint)obj.tag) &&
       (iVar2 = *obj.u.ptr, *(int *)obj.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,obj);
    }
    if ((0xfffffff4 < (uint)JVar6.tag) &&
       (iVar2 = *JVar6.u.ptr, *(int *)JVar6.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar6);
    }
    if ((0xfffffff4 < (uint)op1_00.tag) &&
       (iVar2 = *op1_00.u.ptr, *(int *)op1_00.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,op1_00);
    }
    if ((0xfffffff4 < (uint)op1.tag) &&
       (iVar2 = *op1.u.ptr, *(int *)op1.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,op1);
    }
  }
  else {
    JS_ThrowTypeError(ctx,"not an object");
  }
  uVar5 = 0;
  iVar4 = 6;
  uVar3 = 0;
LAB_00142ca6:
  JVar6.tag = iVar4;
  JVar6.u.ptr = (void *)(uVar5 | uVar3);
  return JVar6;
}

Assistant:

static JSValue js_regexp_Symbol_search(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValueConst rx = this_val;
    JSValue str, previousLastIndex, currentLastIndex, result, index;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    result = JS_UNDEFINED;
    currentLastIndex = JS_UNDEFINED;
    previousLastIndex = JS_UNDEFINED;
    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        goto exception;

    previousLastIndex = JS_GetProperty(ctx, rx, JS_ATOM_lastIndex);
    if (JS_IsException(previousLastIndex))
        goto exception;

    if (!js_same_value(ctx, previousLastIndex, JS_NewInt32(ctx, 0))) {
        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0)) < 0) {
            goto exception;
        }
    }
    result = JS_RegExpExec(ctx, rx, str);
    if (JS_IsException(result))
        goto exception;
    currentLastIndex = JS_GetProperty(ctx, rx, JS_ATOM_lastIndex);
    if (JS_IsException(currentLastIndex))
        goto exception;
    if (js_same_value(ctx, currentLastIndex, previousLastIndex)) {
        JS_FreeValue(ctx, previousLastIndex);
    } else {
        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, previousLastIndex) < 0) {
            previousLastIndex = JS_UNDEFINED;
            goto exception;
        }
    }
    JS_FreeValue(ctx, str);
    JS_FreeValue(ctx, currentLastIndex);

    if (JS_IsNull(result)) {
        return JS_NewInt32(ctx, -1);
    } else {
        index = JS_GetProperty(ctx, result, JS_ATOM_index);
        JS_FreeValue(ctx, result);
        return index;
    }

exception:
    JS_FreeValue(ctx, result);
    JS_FreeValue(ctx, str);
    JS_FreeValue(ctx, currentLastIndex);
    JS_FreeValue(ctx, previousLastIndex);
    return JS_EXCEPTION;
}